

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O0

int encode_default(sproto_arg *args)

{
  lua_State *L_00;
  char *s;
  lua_State *L;
  sproto_arg *args_local;
  
  L_00 = (lua_State *)args->ud;
  lua_pushstring(L_00,args->tagname);
  if (args->index < 1) {
    switch(args->type) {
    case 0:
      lua_pushinteger(L_00,0);
      break;
    case 1:
      lua_pushboolean(L_00,0);
      break;
    case 2:
      lua_pushstring(L_00,"");
      break;
    case 3:
      lua_createtable(L_00,0,1);
      s = sproto_name(args->subtype);
      lua_pushstring(L_00,s);
      lua_setfield(L_00,-2,"__type");
    }
  }
  else {
    lua_createtable(L_00,0,0);
  }
  lua_rawset(L_00,-3);
  return 0;
}

Assistant:

static int
encode_default(const struct sproto_arg *args) {
	lua_State *L = args->ud;
	lua_pushstring(L, args->tagname);
	if (args->index > 0) {
		lua_newtable(L);
	} else {
		switch(args->type) {
		case SPROTO_TINTEGER:
			lua_pushinteger(L, 0);
			break;
		case SPROTO_TBOOLEAN:
			lua_pushboolean(L, 0);
			break;
		case SPROTO_TSTRING:
			lua_pushliteral(L, "");
			break;
		case SPROTO_TSTRUCT:
			lua_createtable(L, 0, 1);
			lua_pushstring(L, sproto_name(args->subtype));
			lua_setfield(L, -2, "__type");
			break;
		}
	}
	lua_rawset(L, -3);
	return 0;
}